

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibPrepareAdd(Sfm_Lib_t *p,word *pTruth,int *Perm,int nFanins,Mio_Cell2_t *pCellBot,
                      Mio_Cell2_t *pCellTop,int InTop)

{
  int i_00;
  int iVar1;
  int iVar2;
  int *piVar3;
  Sfm_Fun_t *pSVar4;
  char local_10c;
  Sfm_Fun_t *local_108;
  int local_b8;
  int nObjsAlloc;
  int iFunc;
  int *pProf;
  int Offset;
  int Prev;
  int Id;
  int k;
  int i;
  int Area;
  int Profile [8];
  int InvPerm [8];
  Sfm_Fun_t *local_40;
  Sfm_Fun_t *pObj;
  Mio_Cell2_t *pCellTop_local;
  Mio_Cell2_t *pCellBot_local;
  int nFanins_local;
  int *Perm_local;
  word *pTruth_local;
  Sfm_Lib_t *p_local;
  
  if (pCellTop == (Mio_Cell2_t *)0x0) {
    local_b8 = 0;
  }
  else {
    local_b8 = (int)pCellTop->AreaW;
  }
  local_b8 = (int)pCellBot->AreaW + local_b8;
  i_00 = Vec_MemHashInsert(p->vTtMem,pTruth);
  iVar1 = Vec_IntSize(&p->vLists);
  if (i_00 == iVar1) {
    Vec_IntPush(&p->vLists,-1);
    Vec_IntPush(&p->vCounts,0);
    Vec_IntPush(&p->vHits,0);
  }
  if (pCellBot == (Mio_Cell2_t *)0x0) {
    __assert_fail("pCellBot != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x15b,
                  "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                 );
  }
  if (p->fDelay == 0) {
    iVar1 = Vec_IntEntry(&p->vLists,i_00);
    for (local_40 = Sfm_LibFun(p,iVar1); local_40 != (Sfm_Fun_t *)0x0;
        local_40 = Sfm_LibFun(p,local_40->Next)) {
      if (local_40->Area <= local_b8) {
        return;
      }
    }
  }
  else {
    iVar1 = Vec_IntSize(&p->vProfs);
    if (iVar1 != p->nObjs) {
      __assert_fail("Vec_IntSize(&p->vProfs) == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x15f,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    Sfm_LibCellProfile(pCellBot,pCellTop,InTop,nFanins,Perm,&i);
    Vec_IntClear(&p->vTemp);
    iVar1 = Vec_IntEntry(&p->vLists,i_00);
    for (local_40 = Sfm_LibFun(p,iVar1); local_40 != (Sfm_Fun_t *)0x0;
        local_40 = Sfm_LibFun(p,local_40->Next)) {
      iVar1 = Sfm_LibFunId(p,local_40);
      Vec_IntPush(&p->vTemp,iVar1);
      iVar1 = Sfm_LibFunId(p,local_40);
      iVar1 = Vec_IntEntry(&p->vProfs,iVar1);
      piVar3 = Vec_IntEntryP(&p->vStore,iVar1);
      iVar1 = Sfm_LibNewIsContained(local_40,piVar3,local_b8,&i,nFanins);
      if (iVar1 != 0) {
        p->nObjSkipped = p->nObjSkipped + 1;
        return;
      }
    }
    Prev = 0;
    for (Id = 0; iVar1 = Vec_IntSize(&p->vTemp), Id < iVar1; Id = Id + 1) {
      iVar1 = Vec_IntEntry(&p->vTemp,Id);
      iVar2 = Vec_IntEntry(&p->vProfs,iVar1);
      piVar3 = Vec_IntEntryP(&p->vStore,iVar2);
      pSVar4 = Sfm_LibFun(p,iVar1);
      iVar2 = Sfm_LibNewContains(pSVar4,piVar3,local_b8,&i,nFanins);
      if (iVar2 == 0) {
        Vec_IntWriteEntry(&p->vTemp,Prev,iVar1);
        Prev = Prev + 1;
      }
      else {
        p->nObjRemoved = p->nObjRemoved + 1;
      }
    }
    if (Prev < Id) {
      if (Prev == 0) {
        Vec_IntWriteEntry(&p->vLists,i_00,-1);
      }
      else {
        Vec_IntShrink(&p->vTemp,Prev);
        pProf._4_4_ = Vec_IntEntry(&p->vTemp,0);
        Vec_IntWriteEntry(&p->vLists,i_00,pProf._4_4_);
        for (Id = 1; iVar1 = Vec_IntSize(&p->vTemp), Id < iVar1; Id = Id + 1) {
          iVar1 = Vec_IntEntry(&p->vTemp,Id);
          pSVar4 = Sfm_LibFun(p,pProf._4_4_);
          pSVar4->Next = iVar1;
          pProf._4_4_ = iVar1;
        }
        pSVar4 = Sfm_LibFun(p,pProf._4_4_);
        pSVar4->Next = -1;
      }
    }
  }
  for (Prev = 0; Prev < nFanins; Prev = Prev + 1) {
    Profile[(long)Perm[Prev] + 6] = Prev;
  }
  if (p->fDelay != 0) {
    iVar1 = Vec_IntSize(&p->vStore);
    Vec_IntPush(&p->vProfs,iVar1);
    for (Prev = 0; Prev < nFanins; Prev = Prev + 1) {
      Vec_IntPush(&p->vStore,(&i)[Prev]);
    }
  }
  if (p->nObjs == p->nObjsAlloc) {
    iVar1 = p->nObjsAlloc << 1;
    if (p->pObjs == (Sfm_Fun_t *)0x0) {
      local_108 = (Sfm_Fun_t *)malloc((long)iVar1 * 0x1c);
    }
    else {
      local_108 = (Sfm_Fun_t *)realloc(p->pObjs,(long)iVar1 * 0x1c);
    }
    p->pObjs = local_108;
    memset(p->pObjs + p->nObjsAlloc,0,(long)p->nObjsAlloc * 0x1c);
    p->nObjsAlloc = iVar1;
  }
  pSVar4 = p->pObjs + p->nObjs;
  pSVar4->Area = local_b8;
  iVar1 = Vec_IntEntry(&p->vLists,i_00);
  pSVar4->Next = iVar1;
  iVar1 = p->nObjs;
  p->nObjs = iVar1 + 1;
  Vec_IntWriteEntry(&p->vLists,i_00,iVar1);
  Vec_IntAddToEntry(&p->vCounts,i_00,1);
  if ((*(uint *)&pCellBot->field_0x10 & 0x3ffffff) < 0x80) {
    pSVar4->pFansB[0] = (char)*(undefined4 *)&pCellBot->field_0x10;
    for (Prev = 0; Prev < (int)(*(uint *)&pCellBot->field_0x10 >> 0x1c); Prev = Prev + 1) {
      pSVar4->pFansB[Prev + 1] = (char)Profile[(long)Prev + 6];
    }
    if (pCellTop != (Mio_Cell2_t *)0x0) {
      if (0x7f < (*(uint *)&pCellTop->field_0x10 & 0x3ffffff)) {
        __assert_fail("pCellTop->Id < 128",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                      ,0x1b0,
                      "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                     );
      }
      pSVar4->pFansT[0] = (char)*(undefined4 *)&pCellTop->field_0x10;
      for (Id = 0; Id < (int)(*(uint *)&pCellTop->field_0x10 >> 0x1c); Id = Id + 1) {
        if (Id == InTop) {
          local_10c = '\x10';
        }
        else {
          local_10c = (char)Profile[(long)Prev + 6];
          Prev = Prev + 1;
        }
        pSVar4->pFansT[Id + 1] = local_10c;
      }
      if (Prev != nFanins) {
        __assert_fail("k == nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                      ,0x1b4,
                      "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                     );
      }
    }
    return;
  }
  __assert_fail("pCellBot->Id < 128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                ,0x1aa,
                "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
               );
}

Assistant:

void Sfm_LibPrepareAdd( Sfm_Lib_t * p, word * pTruth, int * Perm, int nFanins, Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop )
{
    Sfm_Fun_t * pObj;
    int InvPerm[SFM_SUPP_MAX], Profile[SFM_SUPP_MAX];
    int Area = (int)pCellBot->AreaW + (pCellTop ? (int)pCellTop->AreaW : 0);
    int i, k, Id, Prev, Offset, * pProf, iFunc = Vec_MemHashInsert( p->vTtMem, pTruth );
    if ( iFunc == Vec_IntSize(&p->vLists) )
    {
        Vec_IntPush( &p->vLists, -1 );
        Vec_IntPush( &p->vCounts, 0 );
        Vec_IntPush( &p->vHits,   0 );
    }
    assert( pCellBot != NULL );
    // iterate through the supergates of this truth table
    if ( p->fDelay )
    {
        assert( Vec_IntSize(&p->vProfs) == p->nObjs );
        Sfm_LibCellProfile( pCellBot, pCellTop, InTop, nFanins, Perm, Profile );
        // check if new one is contained in old ones
        Vec_IntClear( &p->vTemp );
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            Vec_IntPush( &p->vTemp, Sfm_LibFunId(p, pObj) );
            Offset = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( Sfm_LibNewIsContained(pObj, pProf, Area, Profile, nFanins) )
            {
                p->nObjSkipped++;
                return;
            }
        }
        // check if old ones are contained in new one
        k = 0;
        Vec_IntForEachEntry( &p->vTemp, Id, i )
        {
            Offset = Vec_IntEntry( &p->vProfs, Id );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( !Sfm_LibNewContains(Sfm_LibFun(p, Id), pProf, Area, Profile, nFanins) )
                Vec_IntWriteEntry( &p->vTemp, k++, Id );
            else
                p->nObjRemoved++;
        }
        if ( k < i ) // change
        {
            if ( k == 0 )
                Vec_IntWriteEntry( &p->vLists, iFunc, -1 );
            else
            {
                Vec_IntShrink( &p->vTemp, k );
                Prev = Vec_IntEntry(&p->vTemp, 0);
                Vec_IntWriteEntry( &p->vLists, iFunc, Prev );
                Vec_IntForEachEntryStart( &p->vTemp, Id, i, 1 )
                {
                    Sfm_LibFun(p, Prev)->Next = Id;
                    Prev = Id;
                }
                Sfm_LibFun(p, Prev)->Next = -1;
            }
        }
    }
    else
    {
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            if ( Area >= pObj->Area )
                return;
        }
    }
    for ( k = 0; k < nFanins; k++ )
        InvPerm[Perm[k]] = k;
    // create delay profile
    if ( p->fDelay )
    {
        Vec_IntPush( &p->vProfs, Vec_IntSize(&p->vStore) );
        for ( k = 0; k < nFanins; k++ )
            Vec_IntPush( &p->vStore, Profile[k] );
    }
    // create new object
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjsAlloc = 2 * p->nObjsAlloc;
        p->pObjs = ABC_REALLOC( Sfm_Fun_t, p->pObjs, nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Sfm_Fun_t) * p->nObjsAlloc );
        p->nObjsAlloc = nObjsAlloc;
    }
    pObj = p->pObjs + p->nObjs;
    pObj->Area = Area;
    pObj->Next = Vec_IntEntry(&p->vLists, iFunc);
    Vec_IntWriteEntry( &p->vLists, iFunc, p->nObjs++ );
    Vec_IntAddToEntry( &p->vCounts, iFunc, 1 );
    // create gate
    assert( pCellBot->Id < 128 );
    pObj->pFansB[0] = (char)pCellBot->Id;
    for ( k = 0; k < (int)pCellBot->nFanins; k++ )
        pObj->pFansB[k+1] = InvPerm[k];
    if ( pCellTop == NULL )
        return;
    assert( pCellTop->Id < 128 );
    pObj->pFansT[0] = (char)pCellTop->Id;
    for ( i = 0; i < (int)pCellTop->nFanins; i++ )
        pObj->pFansT[i+1] = (char)(i == InTop ? 16 : InvPerm[k++]);
    assert( k == nFanins );
}